

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O2

void __thiscall
ON_SimpleArray<ON_SerialNumberMap::SN_ELEMENT>::Append
          (ON_SimpleArray<ON_SerialNumberMap::SN_ELEMENT> *this,SN_ELEMENT *x)

{
  undefined8 *puVar1;
  ON__UINT64 *pOVar2;
  undefined8 uVar3;
  ON__UINT64 OVar4;
  SN_ELEMENT *pSVar5;
  undefined8 uVar6;
  ON__UINT64 OVar7;
  undefined8 uVar8;
  unsigned_short uVar9;
  unsigned_short uVar10;
  ON__UINT8 OVar11;
  ON__UINT8 OVar12;
  ON__UINT8 OVar13;
  ON__UINT8 OVar14;
  ON__UINT32 OVar15;
  ON__UINT32 OVar16;
  ON__UINT32 OVar17;
  int iVar18;
  SN_ELEMENT *pSVar19;
  long lVar20;
  long lVar21;
  
  iVar18 = *(int *)(this + 0x10);
  pSVar19 = x;
  if (iVar18 == *(int *)(this + 0x14)) {
    iVar18 = NewCapacity(this);
    if ((*(SN_ELEMENT **)(this + 8) <= x) &&
       (x < *(SN_ELEMENT **)(this + 8) + *(int *)(this + 0x14))) {
      pSVar19 = (SN_ELEMENT *)onmalloc(0x38);
      uVar9 = (x->m_id).Data2;
      uVar10 = (x->m_id).Data3;
      uVar3 = *(undefined8 *)(x->m_id).Data4;
      OVar4 = x->m_sn;
      OVar11 = x->m_sn_active;
      OVar12 = x->m_id_active;
      OVar13 = x->m_reserved1;
      OVar14 = x->m_reserved2;
      OVar15 = x->m_id_crc32;
      pSVar5 = x->m_next;
      OVar16 = (x->m_value).m_u_type;
      OVar17 = (x->m_value).m_u32;
      (pSVar19->m_id).Data1 = (x->m_id).Data1;
      (pSVar19->m_id).Data2 = uVar9;
      (pSVar19->m_id).Data3 = uVar10;
      *(undefined8 *)(pSVar19->m_id).Data4 = uVar3;
      pSVar19->m_sn = OVar4;
      pSVar19->m_sn_active = OVar11;
      pSVar19->m_id_active = OVar12;
      pSVar19->m_reserved1 = OVar13;
      pSVar19->m_reserved2 = OVar14;
      pSVar19->m_id_crc32 = OVar15;
      pSVar19->m_next = pSVar5;
      (pSVar19->m_value).m_u_type = OVar16;
      (pSVar19->m_value).m_u32 = OVar17;
      (pSVar19->m_value).m_u = (x->m_value).m_u;
    }
    Reserve(this,(long)iVar18);
    lVar20 = *(long *)(this + 8);
    if (lVar20 == 0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_array_defs.h"
                 ,0x1f0,"","allocation failure");
      return;
    }
    iVar18 = *(int *)(this + 0x10);
  }
  else {
    lVar20 = *(long *)(this + 8);
  }
  *(int *)(this + 0x10) = iVar18 + 1;
  lVar21 = (long)iVar18 * 0x38;
  *(anon_union_8_5_72d3814f_for_m_u *)(lVar20 + 0x30 + lVar21) = (pSVar19->m_value).m_u;
  uVar3 = *(undefined8 *)&pSVar19->m_id;
  uVar6 = *(undefined8 *)(pSVar19->m_id).Data4;
  OVar4 = pSVar19->m_sn;
  OVar7 = *(ON__UINT64 *)&pSVar19->m_sn_active;
  uVar8 = *(undefined8 *)&pSVar19->m_value;
  puVar1 = (undefined8 *)(lVar20 + 0x20 + lVar21);
  *puVar1 = pSVar19->m_next;
  puVar1[1] = uVar8;
  pOVar2 = (ON__UINT64 *)(lVar20 + 0x10 + lVar21);
  *pOVar2 = OVar4;
  pOVar2[1] = OVar7;
  *(undefined8 *)(lVar20 + lVar21) = uVar3;
  ((undefined8 *)(lVar20 + lVar21))[1] = uVar6;
  if (pSVar19 != x) {
    onfree(pSVar19);
    return;
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Append( const T& x ) 
{
  const T* p = &x;
  if ( m_count == m_capacity ) 
  {
    const int newcapacity = NewCapacity();
    if ( p >= m_a && p < (m_a + m_capacity) )
    {
      // 26 Sep 2005 Dale Lear
      // x is in the block of memory about to be reallocated.
      void* temp = onmalloc(sizeof(T));
      memcpy(temp, (void*)p, sizeof(T));
      p = (T*)temp;
    }
    Reserve(newcapacity);
    if (nullptr == m_a)
    {
      ON_ERROR("allocation failure");
      return;
    }
  }
  m_a[m_count++] = *p;
  if (p != &x)
    onfree((void*)p);
}